

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpersTest.cpp
# Opt level: O2

void __thiscall
Validators_FileNotExists_Test::~Validators_FileNotExists_Test(Validators_FileNotExists_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Validators, FileNotExists) {
    std::string myfile{"TestFileNotUsed.txt"};
    EXPECT_TRUE(CLI::NonexistentPath(myfile).empty());
    bool ok = static_cast<bool>(std::ofstream(myfile.c_str()).put('a')); // create file
    EXPECT_TRUE(ok);
    EXPECT_FALSE(CLI::NonexistentPath(myfile).empty());

    std::remove(myfile.c_str());
    EXPECT_TRUE(CLI::NonexistentPath(myfile).empty());
}